

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

int secp256k1_modinv64_det_check_pow2(secp256k1_modinv64_trans2x2 *t,uint n,int abs)

{
  int iVar1;
  int in_EDX;
  uint in_ESI;
  secp256k1_int128 *in_RDI;
  secp256k1_int128 a;
  secp256k1_int128 *in_stack_00000020;
  int local_4;
  
  secp256k1_i128_det(in_stack_00000020,(int64_t)t,CONCAT44(n,abs),a._8_8_,(int64_t)a);
  iVar1 = secp256k1_i128_check_pow2(in_RDI,in_ESI,in_EDX);
  if (iVar1 == 0) {
    if ((in_EDX != 0) && (iVar1 = secp256k1_i128_check_pow2(in_RDI,in_ESI,in_EDX), iVar1 != 0)) {
      return 1;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int secp256k1_modinv64_det_check_pow2(const secp256k1_modinv64_trans2x2 *t, unsigned int n, int abs) {
    secp256k1_int128 a;
    secp256k1_i128_det(&a, t->u, t->v, t->q, t->r);
    if (secp256k1_i128_check_pow2(&a, n, 1)) return 1;
    if (abs && secp256k1_i128_check_pow2(&a, n, -1)) return 1;
    return 0;
}